

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O1

void __thiscall ItemTable::WhiteRoomOne(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  ItemWrapper *this_02;
  ItemWrapper *pIVar1;
  mapped_type *ppIVar2;
  key_type local_1a4;
  ItemWrapper *local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  Item local_f8;
  Item local_d0;
  Item local_a8;
  Item local_80;
  Item local_58;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Disc","");
  Item::Item(&local_58,&local_118,DISCUS);
  ItemWrapper::ItemWrapper(this_00,&local_58,W_ROOM1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != &local_58.name.field_2) {
    operator_delete(local_58.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  this_01 = (ItemWrapper *)operator_new(0x58);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"PowerCrystal","");
  Item::Item(&local_80,&local_138,POWER_CRYSTAL);
  ItemWrapper::ItemWrapper(this_01,&local_80,W_ROOM1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != &local_80.name.field_2) {
    operator_delete(local_80.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  this_02 = (ItemWrapper *)operator_new(0x58);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Torch","");
  Item::Item(&local_a8,&local_158,TORCH);
  ItemWrapper::ItemWrapper(this_02,&local_a8,W_ROOM1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != &local_a8.name.field_2) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Light Pillar","");
  local_1a0 = pIVar1;
  Item::Item(&local_d0,&local_178,LIGHT_PILLAR);
  ItemWrapper::ItemWrapper(pIVar1,&local_d0,W_ROOM1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p != &local_d0.name.field_2) {
    operator_delete(local_d0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Ladder","");
  Item::Item(&local_f8,&local_198,LADDER);
  ItemWrapper::ItemWrapper(pIVar1,&local_f8,HIDDEN);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
    operator_delete(local_f8.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  local_1a4 = DISCUS;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = this_00;
  local_1a4 = POWER_CRYSTAL;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = this_01;
  local_1a4 = TORCH;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = this_02;
  local_1a4 = LIGHT_PILLAR;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = local_1a0;
  local_1a4 = LADDER;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = pIVar1;
  return;
}

Assistant:

void ItemTable::WhiteRoomOne() {
    //    DISCUS, POWER_CRYSTAL, TORCH, LIGHT_PILLAR,

    ItemWrapper * Discus         = new ItemWrapper(Item("Disc", DISCUS), W_ROOM1);
    ItemWrapper * PowerCrystal   = new ItemWrapper(Item("PowerCrystal", POWER_CRYSTAL), W_ROOM1);
    ItemWrapper * Torch          = new ItemWrapper(Item("Torch", TORCH), W_ROOM1);
    ItemWrapper * LPiller        = new ItemWrapper(Item("Light Pillar", LIGHT_PILLAR), W_ROOM1);
    ItemWrapper * Ladder         = new ItemWrapper(Item("Ladder", LADDER), HIDDEN);

    items[DISCUS] = Discus;
    items[POWER_CRYSTAL] = PowerCrystal;
    items[TORCH] = Torch;
    items[LIGHT_PILLAR] = LPiller;
    items[LADDER] = Ladder;
}